

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtContextCore.cpp
# Opt level: O0

bool __thiscall
ChakraCoreHostScriptContext::ReportModuleCompletion
          (ChakraCoreHostScriptContext *this,ModuleRecordBase *module,Var exception)

{
  JsErrorCode JVar1;
  AutoFilterExceptionRegion local_2c;
  JsErrorCode errorCode;
  AutoFilterExceptionRegion __autoFilterExceptionRegion;
  Var exception_local;
  ModuleRecordBase *module_local;
  ChakraCoreHostScriptContext *this_local;
  
  if (this->reportModuleCompletionCallback == (ReportModuleCompletionCallback)0x0) {
    this_local._7_1_ = 0;
  }
  else {
    _errorCode = exception;
    AutoFilterExceptionRegion::AutoFilterExceptionRegion(&local_2c,ExceptionType_All);
    JVar1 = (*this->reportModuleCompletionCallback)(module,_errorCode);
    if (JVar1 == JsNoError) {
      this_local._7_1_ = 1;
    }
    AutoFilterExceptionRegion::~AutoFilterExceptionRegion(&local_2c);
    if (JVar1 != JsNoError) {
      this_local._7_1_ = 0;
    }
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool ChakraCoreHostScriptContext::ReportModuleCompletion(Js::ModuleRecordBase* module, Js::Var exception)
{
    if (reportModuleCompletionCallback == nullptr)
    {
        return false;
    }
    {
        AUTO_NO_EXCEPTION_REGION;
        JsErrorCode errorCode = reportModuleCompletionCallback(module, exception);
        if (errorCode == JsNoError)
        {
            return true;
        }
    }
    return false;
}